

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::SetPeginWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          uint32_t witness_index,ByteData160 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  ByteData160 *local_28;
  ByteData160 *data_local;
  uint32_t witness_index_local;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  
  local_28 = data;
  data_local._0_4_ = witness_index;
  data_local._4_4_ = tx_in_index;
  _witness_index_local = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  ByteData160::GetBytes(&local_40,data);
  SetPeginWitnessStack(__return_storage_ptr__,this,tx_in_index,witness_index,&local_40);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::SetPeginWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index, const ByteData160 &data) {
  return SetPeginWitnessStack(tx_in_index, witness_index, data.GetBytes());
}